

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen.h
# Opt level: O0

bool __thiscall
pybind11::detail::type_caster<Eigen::SparseMatrix<double,_1,_int>,_void>::load
          (type_caster<Eigen::SparseMatrix<double,_1,_int>,_void> *this,handle src,bool param_2)

{
  bool bVar1;
  long lVar2;
  long rows;
  long cols;
  int *outerIndexPtr;
  int *innerIndexPtr;
  double *valuePtr;
  tuple_accessor local_208;
  tuple_accessor local_1e8;
  MappedSparseMatrix<double,_1313,_int> local_1c8;
  str_attr_accessor local_188;
  long local_168;
  long nnz;
  object local_140;
  tuple local_138;
  tuple shape;
  object local_110;
  handle local_108;
  array_t<int,_16> outerIndices;
  object local_e0;
  handle local_d8;
  array_t<int,_16> innerIndices;
  object local_b0;
  handle local_a8;
  array_t<double,_16> values;
  error_already_set *anon_var_0;
  PyObject *local_88;
  str_attr_accessor local_80;
  object local_60;
  object matrix_type;
  object local_48;
  object local_40;
  object sparse_module;
  object local_30;
  object obj;
  bool param_2_local;
  type_caster<Eigen::SparseMatrix<double,_1,_int>,_void> *this_local;
  handle src_local;
  
  obj.super_handle.m_ptr._7_1_ = param_2;
  this_local = (type_caster<Eigen::SparseMatrix<double,_1,_int>,_void> *)src.m_ptr;
  bVar1 = handle::operator_cast_to_bool((handle *)&this_local);
  if (bVar1) {
    sparse_module.super_handle.m_ptr = (handle)(handle)this_local;
    reinterpret_borrow<pybind11::object>((pybind11 *)&local_30,(handle)this_local);
    module::import((module *)&local_48,"scipy.sparse");
    object::object(&local_40,&local_48);
    module::~module((module *)&local_48);
    object_api<pybind11::handle>::attr
              (&local_80,(object_api<pybind11::handle> *)&local_40,"csr_matrix");
    accessor::operator_cast_to_object((accessor *)&local_60);
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_80);
    local_88 = (PyObject *)
               object_api<pybind11::handle>::get_type((object_api<pybind11::handle> *)&local_30);
    bVar1 = object_api<pybind11::handle>::is
                      ((object_api<pybind11::handle> *)&local_88,
                       (object_api<pybind11::handle> *)&local_60);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      object_api<pybind11::handle>::operator()
                ((object_api<pybind11::handle> *)&anon_var_0,&local_60);
      object::operator=(&local_30,(object *)&anon_var_0);
      object::~object((object *)&anon_var_0);
    }
    object_api<pybind11::handle>::attr
              ((str_attr_accessor *)&innerIndices,(object_api<pybind11::handle> *)&local_30,"data");
    accessor::operator_cast_to_object((accessor *)&local_b0);
    array_t<double,_16>::array_t((array_t<double,_16> *)&local_a8,&local_b0);
    object::~object(&local_b0);
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)&innerIndices);
    object_api<pybind11::handle>::attr
              ((str_attr_accessor *)&outerIndices,(object_api<pybind11::handle> *)&local_30,
               "indices");
    accessor::operator_cast_to_object((accessor *)&local_e0);
    array_t<int,_16>::array_t((array_t<int,_16> *)&local_d8,&local_e0);
    object::~object(&local_e0);
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)&outerIndices);
    object_api<pybind11::handle>::attr
              ((str_attr_accessor *)&shape,(object_api<pybind11::handle> *)&local_30,"indptr");
    accessor::operator_cast_to_object((accessor *)&local_110);
    array_t<int,_16>::array_t((array_t<int,_16> *)&local_108,&local_110);
    object::~object(&local_110);
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)&shape);
    object_api<pybind11::handle>::attr
              ((str_attr_accessor *)&nnz,(object_api<pybind11::handle> *)&local_30,"shape");
    accessor::operator_cast_to_object((accessor *)&local_140);
    tuple::tuple(&local_138,&local_140);
    object::~object(&local_140);
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
              ((accessor<pybind11::detail::accessor_policies::str_attr> *)&nnz);
    object_api<pybind11::handle>::attr(&local_188,(object_api<pybind11::handle> *)&local_30,"nnz");
    lVar2 = accessor<pybind11::detail::accessor_policies::str_attr>::cast<long>(&local_188);
    accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_188);
    local_168 = lVar2;
    bVar1 = handle::operator_cast_to_bool(&local_a8);
    if (((bVar1) && (bVar1 = handle::operator_cast_to_bool(&local_d8), bVar1)) &&
       (bVar1 = handle::operator_cast_to_bool(&local_108), bVar1)) {
      tuple::operator[](&local_1e8,&local_138,0);
      rows = accessor<pybind11::detail::accessor_policies::tuple_item>::cast<long>(&local_1e8);
      tuple::operator[](&local_208,&local_138,1);
      cols = accessor<pybind11::detail::accessor_policies::tuple_item>::cast<long>(&local_208);
      lVar2 = local_168;
      outerIndexPtr = array_t<int,_16>::mutable_data<>((array_t<int,_16> *)&local_108);
      innerIndexPtr = array_t<int,_16>::mutable_data<>((array_t<int,_16> *)&local_d8);
      valuePtr = array_t<double,_16>::mutable_data<>((array_t<double,_16> *)&local_a8);
      Eigen::MappedSparseMatrix<double,_1313,_int>::MappedSparseMatrix
                (&local_1c8,rows,cols,lVar2,outerIndexPtr,innerIndexPtr,valuePtr,(StorageIndex *)0x0
                );
      Eigen::SparseMatrix<double,1,int>::operator=
                ((SparseMatrix<double,1,int> *)this,
                 (SparseMatrixBase<Eigen::Map<Eigen::SparseMatrix<double,_1313,_int>,_0,_Eigen::Stride<0,_0>_>_>
                  *)&local_1c8);
      Eigen::MappedSparseMatrix<double,_1313,_int>::~MappedSparseMatrix(&local_1c8);
      accessor<pybind11::detail::accessor_policies::tuple_item>::~accessor(&local_208);
      accessor<pybind11::detail::accessor_policies::tuple_item>::~accessor(&local_1e8);
      src_local.m_ptr._7_1_ = 1;
    }
    else {
      src_local.m_ptr._7_1_ = 0;
    }
    values.super_array.super_buffer.super_object.super_handle.m_ptr._4_4_ = 1;
    tuple::~tuple(&local_138);
    array_t<int,_16>::~array_t((array_t<int,_16> *)&local_108);
    array_t<int,_16>::~array_t((array_t<int,_16> *)&local_d8);
    array_t<double,_16>::~array_t((array_t<double,_16> *)&local_a8);
    object::~object(&local_60);
    object::~object(&local_40);
    object::~object(&local_30);
  }
  else {
    src_local.m_ptr._7_1_ = 0;
  }
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool) {
        if (!src)
            return false;

        auto obj = reinterpret_borrow<object>(src);
        object sparse_module = module::import("scipy.sparse");
        object matrix_type = sparse_module.attr(
            rowMajor ? "csr_matrix" : "csc_matrix");

        if (!obj.get_type().is(matrix_type)) {
            try {
                obj = matrix_type(obj);
            } catch (const error_already_set &) {
                return false;
            }
        }

        auto values = array_t<Scalar>((object) obj.attr("data"));
        auto innerIndices = array_t<StorageIndex>((object) obj.attr("indices"));
        auto outerIndices = array_t<StorageIndex>((object) obj.attr("indptr"));
        auto shape = pybind11::tuple((pybind11::object) obj.attr("shape"));
        auto nnz = obj.attr("nnz").cast<Index>();

        if (!values || !innerIndices || !outerIndices)
            return false;

        value = Eigen::MappedSparseMatrix<Scalar, Type::Flags, StorageIndex>(
            shape[0].cast<Index>(), shape[1].cast<Index>(), nnz,
            outerIndices.mutable_data(), innerIndices.mutable_data(), values.mutable_data());

        return true;
    }